

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemotelyControlledSampler.h
# Opt level: O3

void __thiscall
jaegertracing::samplers::RemotelyControlledSampler::~RemotelyControlledSampler
          (RemotelyControlledSampler *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  pointer pcVar2;
  int in_ESI;
  
  (this->super_Sampler)._vptr_Sampler = (_func_int **)&PTR__RemotelyControlledSampler_00272180;
  close(this,in_ESI);
  if ((this->_thread)._M_id._M_thread != 0) {
    std::terminate();
  }
  std::condition_variable::~condition_variable(&this->_shutdownCV);
  p_Var1 = (this->_manager).
           super___shared_ptr<jaegertracing::sampling_manager::thrift::SamplingManagerIf,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var1 = (this->_sampler).
           super___shared_ptr<jaegertracing::samplers::Sampler,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  pcVar2 = (this->_samplingServerURL)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->_samplingServerURL).field_2) {
    operator_delete(pcVar2);
  }
  pcVar2 = (this->_serviceName)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->_serviceName).field_2) {
    operator_delete(pcVar2);
    return;
  }
  return;
}

Assistant:

~RemotelyControlledSampler() { close(); }